

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O1

bool __thiscall HACD::ICHUll::CleanEdges(ICHUll *this)

{
  pointer ppCVar1;
  CircularListElement<HACD::TMMEdge> *pCVar2;
  CircularListElement<HACD::TMMTriangle> *pCVar3;
  pointer ppCVar4;
  
  ppCVar1 = (this->m_edgesToUpdate).
            super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar4 = (this->m_edgesToUpdate).
                 super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1;
      ppCVar4 = ppCVar4 + 1) {
    pCVar2 = *ppCVar4;
    pCVar3 = (pCVar2->m_data).m_newFace;
    if (pCVar3 != (CircularListElement<HACD::TMMTriangle> *)0x0) {
      (pCVar2->m_data).m_triangles[((pCVar2->m_data).m_triangles[0]->m_data).m_visible ^ 1] = pCVar3
      ;
      (pCVar2->m_data).m_newFace = (CircularListElement<HACD::TMMTriangle> *)0x0;
    }
  }
  ppCVar4 = (this->m_edgesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_edgesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar4 != ppCVar1) {
    do {
      CircularList<HACD::TMMEdge>::Delete(&(this->m_mesh).m_edges,*ppCVar4);
      ppCVar4 = ppCVar4 + 1;
    } while (ppCVar4 != ppCVar1);
  }
  ppCVar4 = (this->m_edgesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_edgesToDelete).
      super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppCVar4) {
    (this->m_edgesToDelete).
    super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppCVar4;
  }
  ppCVar4 = (this->m_edgesToUpdate).
            super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_edgesToUpdate).
      super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppCVar4) {
    (this->m_edgesToUpdate).
    super__Vector_base<HACD::CircularListElement<HACD::TMMEdge>_*,_std::allocator<HACD::CircularListElement<HACD::TMMEdge>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppCVar4;
  }
  return true;
}

Assistant:

bool ICHUll::CleanEdges()
    {
        // integrate the new faces into the data structure
        CircularListElement<TMMEdge> * e;
        const std::vector<CircularListElement<TMMEdge> *>::iterator itEndUpdate = m_edgesToUpdate.end();
        for(std::vector<CircularListElement<TMMEdge> *>::iterator it = m_edgesToUpdate.begin(); it != itEndUpdate; ++it)
        {
            e = *it;
            if ( e->GetData().m_newFace )
            {
                if ( e->GetData().m_triangles[0]->GetData().m_visible)
                {
                    e->GetData().m_triangles[0] = e->GetData().m_newFace;
                }
                else
                {
                    e->GetData().m_triangles[1] = e->GetData().m_newFace;
                }
                e->GetData().m_newFace = 0;
            }           
        }
        // delete edges maked for deletion
        CircularList<TMMEdge> & edges = m_mesh.GetEdges();
        const std::vector<CircularListElement<TMMEdge> *>::iterator itEndDelete = m_edgesToDelete.end();
        for(std::vector<CircularListElement<TMMEdge> *>::iterator it = m_edgesToDelete.begin(); it != itEndDelete; ++it)
        {
            edges.Delete(*it);         
        }
		m_edgesToDelete.clear();
        m_edgesToUpdate.clear();
        return true;
    }